

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShader.cpp
# Opt level: O3

void __thiscall rsg::Shader::tokenize(Shader *this,GeneratorState *state,TokenStream *str)

{
  Statement *pSVar1;
  uint uVar2;
  pointer pTVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  Token local_78;
  Token local_68;
  Token local_58;
  Token local_48;
  Token local_38;
  
  if (state->m_shader->m_type == TYPE_FRAGMENT) {
    local_78.m_type = PRECISION;
    pTVar3 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar4 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pTVar3 >> 4;
    sVar5 = str->m_numTokens;
    if (sVar4 == sVar5) {
      std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x40);
      pTVar3 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar5 = str->m_numTokens;
    }
    Token::operator=(pTVar3 + sVar5,&local_78);
    sVar4 = str->m_numTokens;
    sVar5 = sVar4 + 1;
    str->m_numTokens = sVar5;
    local_38.m_type = MEDIUM_PRECISION;
    pTVar3 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)pTVar3 >> 4 == sVar5) {
      std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x41);
      pTVar3 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar5 = str->m_numTokens;
    }
    Token::operator=(pTVar3 + sVar5,&local_38);
    sVar4 = str->m_numTokens;
    sVar5 = sVar4 + 1;
    str->m_numTokens = sVar5;
    local_48.m_type = FLOAT;
    pTVar3 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)pTVar3 >> 4 == sVar5) {
      std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x41);
      pTVar3 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar5 = str->m_numTokens;
    }
    Token::operator=(pTVar3 + sVar5,&local_48);
    sVar4 = str->m_numTokens;
    sVar5 = sVar4 + 1;
    str->m_numTokens = sVar5;
    local_58.m_type = SEMICOLON;
    pTVar3 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)pTVar3 >> 4 == sVar5) {
      std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x41);
      pTVar3 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar5 = str->m_numTokens;
    }
    Token::operator=(pTVar3 + sVar5,&local_58);
    sVar4 = str->m_numTokens;
    sVar5 = sVar4 + 1;
    str->m_numTokens = sVar5;
    local_68.m_type = NEWLINE;
    pTVar3 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)pTVar3 >> 4 == sVar5) {
      std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x41);
      pTVar3 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar5 = str->m_numTokens;
    }
    Token::operator=(pTVar3 + sVar5,&local_68);
    str->m_numTokens = str->m_numTokens + 1;
    Token::~Token(&local_68);
    Token::~Token(&local_58);
    Token::~Token(&local_48);
    Token::~Token(&local_38);
    Token::~Token(&local_78);
  }
  uVar2 = (int)((ulong)((long)(this->m_globalStatements).
                              super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_globalStatements).
                             super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1;
  if (-1 < (int)uVar2) {
    uVar6 = (ulong)uVar2;
    do {
      pSVar1 = (this->m_globalStatements).
               super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar6];
      (*pSVar1->_vptr_Statement[3])(pSVar1,state,str);
      bVar9 = uVar6 != 0;
      uVar6 = uVar6 - 1;
    } while (bVar9);
  }
  uVar2 = (int)((ulong)((long)(this->m_functions).
                              super__Vector_base<rsg::Function_*,_std::allocator<rsg::Function_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_functions).
                             super__Vector_base<rsg::Function_*,_std::allocator<rsg::Function_*>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3) - 1;
  if (-1 < (int)uVar2) {
    lVar7 = (ulong)uVar2 + 1;
    do {
      local_78.m_type = NEWLINE;
      pTVar3 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar4 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pTVar3 >> 4;
      sVar5 = str->m_numTokens;
      if (sVar4 == sVar5) {
        std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x40);
        pTVar3 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl
                 .super__Vector_impl_data._M_start;
        sVar5 = str->m_numTokens;
      }
      Token::operator=(pTVar3 + sVar5,&local_78);
      str->m_numTokens = str->m_numTokens + 1;
      Token::~Token(&local_78);
      Function::tokenize((this->m_functions).
                         super__Vector_base<rsg::Function_*,_std::allocator<rsg::Function_*>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar7 + -1],state,str);
      lVar8 = lVar7 + -1;
      bVar9 = 0 < lVar7;
      lVar7 = lVar8;
    } while (lVar8 != 0 && bVar9);
  }
  local_78.m_type = NEWLINE;
  pTVar3 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar4 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pTVar3 >> 4;
  sVar5 = str->m_numTokens;
  if (sVar4 == sVar5) {
    std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x40);
    pTVar3 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar5 = str->m_numTokens;
  }
  Token::operator=(pTVar3 + sVar5,&local_78);
  str->m_numTokens = str->m_numTokens + 1;
  Token::~Token(&local_78);
  Function::tokenize(&this->m_mainFunction,state,str);
  return;
}

Assistant:

void Shader::tokenize (GeneratorState& state, TokenStream& str) const
{
	// Add default precision for float in fragment shaders \todo [pyry] Proper precision handling
	if (state.getShader().getType() == Shader::TYPE_FRAGMENT)
		str << Token::PRECISION << Token::MEDIUM_PRECISION << Token::FLOAT << Token::SEMICOLON << Token::NEWLINE;

	// Tokenize global declaration statements
	for (int ndx = (int)m_globalStatements.size()-1; ndx >= 0; ndx--)
		m_globalStatements[ndx]->tokenize(state, str);

	// Tokenize all functions
	for (int ndx = (int)m_functions.size()-1; ndx >= 0; ndx--)
	{
		str << Token::NEWLINE;
		m_functions[ndx]->tokenize(state, str);
	}

	// Tokenize main
	str << Token::NEWLINE;
	m_mainFunction.tokenize(state, str);
}